

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::Data
          (Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *this,
          Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  Data *pDVar3;
  ulong uVar4;
  Node<ProKey,_QSet<ProKey>_> *this_00;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  R RVar8;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar6 = other->numBuckets;
  sVar7 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar7;
  this->spans = (Span *)0x0;
  RVar8 = allocateSpans(sVar6);
  this->spans = (Span *)RVar8.spans;
  if (RVar8.nSpans != 0) {
    lVar5 = 0;
    sVar6 = 0;
    do {
      pSVar1 = other->spans;
      sVar7 = 0;
      do {
        uVar4 = (ulong)pSVar1->offsets[sVar7 + lVar5];
        if (uVar4 != 0xff) {
          pEVar2 = pSVar1[sVar6].entries;
          this_00 = Span<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::insert
                              (this->spans + sVar6,sVar7);
          ProString::ProString((ProString *)this_00,(ProString *)(pEVar2 + uVar4));
          pDVar3 = *(Data **)(pEVar2[uVar4].storage.data + 0x30);
          (this_00->value).q_hash.d = pDVar3;
          if ((pDVar3 != (Data *)0x0) &&
             ((pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
            LOCK();
            (pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != 0x80);
      sVar6 = sVar6 + 1;
      lVar5 = lVar5 + 0x90;
    } while (sVar6 != RVar8.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }